

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

CURLcode Curl_cf_http_proxy_insert_after(Curl_cfilter *cf_at,Curl_easy *data)

{
  CURLcode local_2c;
  void *pvStack_28;
  CURLcode result;
  cf_proxy_ctx *ctx;
  Curl_cfilter *cf;
  Curl_easy *data_local;
  Curl_cfilter *cf_at_local;
  
  cf = (Curl_cfilter *)data;
  data_local = (Curl_easy *)cf_at;
  pvStack_28 = (*Curl_ccalloc)(1,8);
  if (pvStack_28 == (void *)0x0) {
    local_2c = CURLE_OUT_OF_MEMORY;
  }
  else {
    local_2c = Curl_cf_create((Curl_cfilter **)&ctx,&Curl_cft_http_proxy,pvStack_28);
    if (local_2c == CURLE_OK) {
      pvStack_28 = (void *)0x0;
      Curl_conn_cf_insert_after((Curl_cfilter *)data_local,(Curl_cfilter *)ctx);
    }
  }
  (*Curl_cfree)(pvStack_28);
  return local_2c;
}

Assistant:

CURLcode Curl_cf_http_proxy_insert_after(struct Curl_cfilter *cf_at,
                                         struct Curl_easy *data)
{
  struct Curl_cfilter *cf;
  struct cf_proxy_ctx *ctx = NULL;
  CURLcode result;

  (void)data;
  ctx = calloc(1, sizeof(*ctx));
  if(!ctx) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }
  result = Curl_cf_create(&cf, &Curl_cft_http_proxy, ctx);
  if(result)
    goto out;
  ctx = NULL;
  Curl_conn_cf_insert_after(cf_at, cf);

out:
  free(ctx);
  return result;
}